

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O1

Vec_Int_t * Saig_ManFindIsoPermCos(Aig_Man_t *pAig,Vec_Int_t *vPermCis)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  int *piVar3;
  uint *__ptr;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  size_t __nmemb;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  
  if (vPermCis->nSize != pAig->nObjs[2]) {
    __assert_fail("Vec_IntSize(vPermCis) == Aig_ManCiNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigIso.c"
                  ,0x34,"Vec_Int_t *Saig_ManFindIsoPermCos(Aig_Man_t *, Vec_Int_t *)");
  }
  iVar1 = pAig->nObjs[3];
  p = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar6;
  if (iVar6 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar6 << 2);
  }
  p->pArray = piVar3;
  uVar2 = pAig->nTruePos;
  if (uVar2 == 1) {
    Vec_IntPush(p,0);
  }
  else {
    __ptr = (uint *)malloc(0x10);
    uVar7 = 8;
    if (6 < uVar2 - 1) {
      uVar7 = uVar2;
    }
    __ptr[1] = 0;
    *__ptr = uVar7;
    if (uVar7 == 0) {
      pvVar4 = (void *)0x0;
    }
    else {
      pvVar4 = malloc((long)(int)uVar7 << 3);
    }
    *(void **)(__ptr + 2) = pvVar4;
    if (0 < pAig->nTruePos) {
      lVar8 = 0;
      do {
        if (pAig->vCos->nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar4 = pAig->vCos->pArray[lVar8];
        uVar11 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
        if (((*(uint *)(uVar11 + 0x18) & 7) != 1) && (*(int *)(uVar11 + 0x28) < 1)) {
          __assert_fail("Aig_ObjIsConst1(pFanin) || pFanin->iData > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigIso.c"
                        ,0x3e,"Vec_Int_t *Saig_ManFindIsoPermCos(Aig_Man_t *, Vec_Int_t *)");
        }
        if (*(int *)(uVar11 + 0x28) < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        *(uint *)((long)pvVar4 + 0x28) =
             ((uint)*(ulong *)((long)pvVar4 + 8) & 1) + *(int *)(uVar11 + 0x28) * 2;
        uVar2 = __ptr[1];
        uVar7 = *__ptr;
        if (uVar2 == uVar7) {
          if ((int)uVar7 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar5 = malloc(0x80);
            }
            else {
              pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar9 = 0x10;
          }
          else {
            uVar9 = uVar7 * 2;
            if ((int)uVar9 <= (int)uVar7) goto LAB_006abffa;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar5 = malloc((ulong)uVar7 << 4);
            }
            else {
              pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar7 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar5;
          *__ptr = uVar9;
        }
LAB_006abffa:
        __ptr[1] = uVar2 + 1;
        *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar2 * 8) = pvVar4;
        lVar8 = lVar8 + 1;
      } while (lVar8 < pAig->nTruePos);
    }
    uVar2 = __ptr[1];
    __nmemb = (size_t)(int)uVar2;
    if (1 < (long)__nmemb) {
      qsort(*(void **)(__ptr + 2),__nmemb,8,Iso_ObjCompareByData);
    }
    if (0 < (int)uVar2) {
      lVar8 = *(long *)(__ptr + 2);
      sVar10 = 0;
      do {
        piVar3 = *(int **)(lVar8 + sVar10 * 8);
        if (0xfffffffd < (piVar3[6] & 7U) - 7) {
          __assert_fail("!Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                        ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
        }
        Vec_IntPush(p,*piVar3);
        sVar10 = sVar10 + 1;
      } while (__nmemb != sVar10);
    }
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
  }
  uVar2 = pAig->nTruePis;
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < vPermCis->nSize) {
    iVar1 = pAig->nTruePos;
    do {
      if ((int)uVar2 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p,vPermCis->pArray[uVar11] + (iVar1 - uVar2));
      uVar11 = uVar11 + 1;
    } while ((int)uVar11 < vPermCis->nSize);
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the canonical permutation of the COs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Saig_ManFindIsoPermCos( Aig_Man_t * pAig, Vec_Int_t * vPermCis )
{
    extern int Iso_ObjCompareByData( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 );
    Vec_Int_t * vPermCos;
    Aig_Obj_t * pObj, * pFanin;
    int i, Entry, Diff;
    assert( Vec_IntSize(vPermCis) == Aig_ManCiNum(pAig) );
    vPermCos = Vec_IntAlloc( Aig_ManCoNum(pAig) );
    if ( Saig_ManPoNum(pAig) == 1 )
        Vec_IntPush( vPermCos, 0 );
    else
    {
        Vec_Ptr_t * vRoots = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
        Saig_ManForEachPo( pAig, pObj, i )
        {
            pFanin = Aig_ObjFanin0(pObj);
            assert( Aig_ObjIsConst1(pFanin) || pFanin->iData > 0 );
            pObj->iData = Abc_Var2Lit( pFanin->iData, Aig_ObjFaninC0(pObj) );
            Vec_PtrPush( vRoots, pObj );
        }
        Vec_PtrSort( vRoots, (int (*)(void))Iso_ObjCompareByData );
        Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
            Vec_IntPush( vPermCos, Aig_ObjCioId(pObj) );
        Vec_PtrFree( vRoots );
    }
    // add flop outputs
    Diff = Saig_ManPoNum(pAig) - Saig_ManPiNum(pAig);
    Vec_IntForEachEntryStart( vPermCis, Entry, i, Saig_ManPiNum(pAig) )
        Vec_IntPush( vPermCos, Entry + Diff );
    return vPermCos;
}